

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::ScanLineInputFile::Data::LineBufferTask::execute(LineBufferTask *this)

{
  Data *pDVar1;
  
  pDVar1 = this->_ifd;
  anon_unknown_6::ScanLineProcess::run_decode
            (this->_line,
             *(pDVar1->_ctxt->_ctxt).
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pDVar1->partNumber,this->_outfb,this->_fby,this->_last_fby,&pDVar1->fill_list);
  return;
}

Assistant:

void ScanLineInputFile::Data::LineBufferTask::execute ()
{
    try
    {
        _line->run_decode (
            *(_ifd->_ctxt),
            _ifd->partNumber,
            _outfb,
            _fby,
            _last_fby,
            _ifd->fill_list);
    }
    catch (std::exception &e)
    {
        _line_group->record_failure (e.what ());
    }
    catch (...)
    {
        _line_group->record_failure ("Unknown exception");
    }
}